

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_15::BinaryReaderObjdumpDisassemble::OnOpcodeUint32
          (BinaryReaderObjdumpDisassemble *this,uint32_t value)

{
  string_view sVar1;
  
  if (this->in_function_body == true) {
    if ((this->super_BinaryReaderObjdumpBase).current_opcode.enum_ == DataDrop) {
      sVar1 = ObjdumpNames::Get(&((this->super_BinaryReaderObjdumpBase).objdump_state_)->
                                 segment_names,value);
      if (sVar1._M_len != 0) {
        LogOpcode(this,"%d <%.*s>",value,(ulong)(uint)sVar1._M_len,sVar1._M_str);
        return (Result)Ok;
      }
    }
    LogOpcode(this,"%u",value);
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdumpDisassemble::OnOpcodeUint32(uint32_t value) {
  if (!in_function_body) {
    return Result::Ok;
  }
  std::string_view name;
  if (current_opcode == Opcode::DataDrop &&
      !(name = GetSegmentName(value)).empty()) {
    LogOpcode("%d <" PRIstringview ">", value,
              WABT_PRINTF_STRING_VIEW_ARG(name));
  } else {
    LogOpcode("%u", value);
  }
  return Result::Ok;
}